

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriter.cpp
# Opt level: O3

void __thiscall adios2::core::engine::SscWriter::PerformPuts(SscWriter *this)

{
  int iVar1;
  undefined8 uVar2;
  ScopedTimer __var275;
  ScopedTimer local_10;
  
  if (PerformPuts()::__var75 == '\0') {
    iVar1 = __cxa_guard_acquire(&PerformPuts()::__var75);
    if (iVar1 != 0) {
      uVar2 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscWriter.cpp"
                                  ,"virtual void adios2::core::engine::SscWriter::PerformPuts()",
                                  0x4b);
      PerformPuts::__var75 = (void *)ps_timer_create_(uVar2);
      __cxa_guard_release(&PerformPuts()::__var75);
    }
  }
  local_10.m_timer = PerformPuts::__var75;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  (*((this->m_EngineInstance).
     super___shared_ptr<adios2::core::engine::ssc::SscWriterBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->_vptr_SscWriterBase[4])();
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_10);
  return;
}

Assistant:

void SscWriter::PerformPuts()
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    m_EngineInstance->PerformPuts();
}